

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void inspect_serialized_object
               (FILE *serialized_bytes,bool *is_isotree_model,bool *is_compatible,
               bool *has_combined_objects,bool *has_IsoForest,bool *has_ExtIsoForest,
               bool *has_Imputer,bool *has_Indexer,bool *has_metadata,size_t *size_metadata)

{
  bool *unaff_RBX;
  bool *in_RSI;
  bool *in_RDI;
  bool *unaff_retaddr;
  bool *in_stack_00000008;
  _IO_FILE **in_stack_00000010;
  FILE *in;
  bool *in_stack_00000060;
  size_t *in_stack_00000068;
  
  inspect_serialized_object<_IO_FILE*>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,in_RDI,in_RSI,
             is_isotree_model,(bool *)serialized_bytes,in_stack_00000060,in_stack_00000068);
  return;
}

Assistant:

void inspect_serialized_object
(
    FILE *serialized_bytes,
    bool &is_isotree_model,
    bool &is_compatible,
    bool &has_combined_objects,
    bool &has_IsoForest,
    bool &has_ExtIsoForest,
    bool &has_Imputer,
    bool &has_Indexer,
    bool &has_metadata,
    size_t &size_metadata
)
{
    FILE *in = serialized_bytes;
    inspect_serialized_object<FILE*>(
        in,
        is_isotree_model,
        is_compatible,
        has_combined_objects,
        has_IsoForest,
        has_ExtIsoForest,
        has_Imputer,
        has_Indexer,
        has_metadata,
        size_metadata
    );
}